

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManBuiltInSimResimulate(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = p->nObjs;
  if (0 < iVar2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar4);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Gia_ManBuiltInSimPerformInt(p,(int)lVar3);
        iVar2 = p->nObjs;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < iVar2);
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimResimulate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;  int iObj;
    Gia_ManForEachAnd( p, pObj, iObj )
        Gia_ManBuiltInSimPerformInt( p, iObj );
}